

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_update_rates
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  opj_image_t *poVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  OPJ_OFF_T OVar7;
  OPJ_BYTE *pOVar8;
  OPJ_UINT32 OVar9;
  code *pcVar10;
  long lVar11;
  ulong uVar12;
  OPJ_UINT32 *pOVar13;
  OPJ_UINT32 OVar14;
  opj_tcp_t *poVar15;
  OPJ_BOOL OVar16;
  OPJ_UINT32 OVar17;
  int iVar18;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  OPJ_FLOAT32 *pOVar21;
  opj_image_comp_t *poVar22;
  ulong uVar23;
  uint uVar24;
  opj_tcp_t *poVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x13be,
                  "OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_stream == (opj_stream_private_t *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x13c0,
                    "OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    poVar3 = p_j2k->m_private_image;
    poVar25 = (p_j2k->m_cp).tcps;
    poVar22 = poVar3->comps;
    OVar20 = poVar22->dx;
    OVar9 = poVar22->dy;
    iVar4 = poVar22->prec * poVar3->numcomps;
    OVar7 = opj_stream_tell(p_stream);
    uVar26 = (p_j2k->m_cp).th;
    uVar5 = (p_j2k->m_cp).tw * uVar26;
    pcVar10 = opj_j2k_get_tp_stride;
    if ((*(byte *)((long)&(p_j2k->m_cp).m_specific_param + 0x11) & 8) == 0) {
      pcVar10 = opj_j2k_get_default_stride;
    }
    if (uVar26 != 0) {
      fVar27 = (float)(OVar20 * OVar9 * 8);
      uVar24 = 0;
      do {
        if ((p_j2k->m_cp).tw != 0) {
          uVar26 = 0;
          do {
            fVar28 = (float)(*pcVar10)(poVar25);
            uVar1 = poVar25->numlayers;
            OVar20 = (p_j2k->m_cp).tdx;
            OVar9 = (p_j2k->m_cp).tx0;
            OVar17 = (p_j2k->m_cp).ty0;
            OVar14 = OVar20 * uVar26 + OVar9;
            if ((int)OVar14 <= (int)poVar3->x0) {
              OVar14 = poVar3->x0;
            }
            OVar2 = (p_j2k->m_cp).tdy;
            OVar19 = OVar2 * uVar24 + OVar17;
            if ((int)OVar19 <= (int)poVar3->y0) {
              OVar19 = poVar3->y0;
            }
            uVar26 = uVar26 + 1;
            OVar9 = OVar20 * uVar26 + OVar9;
            if ((int)poVar3->x1 <= (int)OVar9) {
              OVar9 = poVar3->x1;
            }
            OVar17 = OVar2 * (uVar24 + 1) + OVar17;
            if ((int)poVar3->y1 <= (int)OVar17) {
              OVar17 = poVar3->y1;
            }
            if (0.0 < (float)poVar25->rates[0]) {
              poVar25->rates[0] =
                   (OPJ_FLOAT32)
                   ((float)((OVar17 - OVar19) * (OVar9 - OVar14) * iVar4) /
                    ((float)poVar25->rates[0] * fVar27) - fVar28 / (float)uVar1);
            }
            if (1 < uVar1) {
              lVar11 = 0;
              do {
                if (0.0 < (float)poVar25->rates[lVar11 + 1]) {
                  poVar25->rates[lVar11 + 1] =
                       (OPJ_FLOAT32)
                       ((float)((OVar17 - OVar19) * (OVar9 - OVar14) * iVar4) /
                        ((float)poVar25->rates[lVar11 + 1] * fVar27) - fVar28 / (float)uVar1);
                }
                lVar11 = lVar11 + 1;
              } while (uVar1 - 1 != (int)lVar11);
            }
            poVar25 = poVar25 + 1;
          } while (uVar26 < (p_j2k->m_cp).tw);
        }
        uVar24 = uVar24 + 1;
        uVar26 = (p_j2k->m_cp).th;
      } while (uVar24 < uVar26);
    }
    poVar25 = (p_j2k->m_cp).tcps;
    if (uVar26 != 0) {
      fVar27 = (float)OVar7 / (float)uVar5;
      OVar20 = (p_j2k->m_cp).tw;
      uVar5 = 0;
      poVar15 = poVar25;
      do {
        if (OVar20 != 0) {
          OVar9 = 0;
          do {
            if ((0.0 < (float)poVar15->rates[0]) &&
               (fVar28 = (float)poVar15->rates[0] - fVar27, poVar15->rates[0] = (OPJ_FLOAT32)fVar28,
               fVar28 < 30.0)) {
              poVar15->rates[0] = 30.0;
            }
            pOVar21 = poVar15->rates + 1;
            if (1 < poVar15->numlayers - 1) {
              iVar4 = poVar15->numlayers - 2;
              do {
                if (0.0 < (float)*pOVar21) {
                  fVar28 = (float)*pOVar21 - fVar27;
                  *pOVar21 = (OPJ_FLOAT32)fVar28;
                  if (fVar28 < (float)pOVar21[-1] + 10.0) {
                    *pOVar21 = (OPJ_FLOAT32)((float)pOVar21[-1] + 20.0);
                  }
                }
                pOVar21 = pOVar21 + 1;
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
            }
            if (0.0 < (float)*pOVar21) {
              fVar28 = (float)*pOVar21 - (fVar27 + 2.0);
              *pOVar21 = (OPJ_FLOAT32)fVar28;
              if (fVar28 < (float)pOVar21[-1] + 10.0) {
                *pOVar21 = (OPJ_FLOAT32)((float)pOVar21[-1] + 20.0);
              }
            }
            poVar15 = poVar15 + 1;
            OVar9 = OVar9 + 1;
          } while (OVar9 != OVar20);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar26);
    }
    OVar20 = poVar3->numcomps;
    if (OVar20 == 0) {
      iVar4 = 500;
    }
    else {
      poVar22 = poVar3->comps;
      uVar5 = 0;
      do {
        uVar12 = (ulong)poVar22->dx;
        if ((uVar12 == 0) || (uVar23 = (ulong)poVar22->dy, uVar23 == 0)) {
          __assert_fail("b",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                        ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
        }
        uVar5 = uVar5 + (int)(((uVar23 + (p_j2k->m_cp).tdy) - 1) / uVar23) *
                        (int)((((p_j2k->m_cp).tdx + uVar12) - 1) / uVar12) * poVar22->prec;
        poVar22 = poVar22 + 1;
        OVar20 = OVar20 - 1;
      } while (OVar20 != 0);
      iVar4 = (int)(long)((double)uVar5 * 1.4 * 0.125) + 500;
    }
    iVar18 = uVar26 * (p_j2k->m_cp).tw;
    if (iVar18 == 0) {
      iVar18 = 0;
    }
    else {
      pOVar13 = &poVar25->m_nb_tile_parts;
      uVar26 = 0;
      do {
        uVar5 = *pOVar13;
        if (*pOVar13 < uVar26) {
          uVar5 = uVar26;
        }
        uVar26 = uVar5;
        pOVar13 = pOVar13 + 0x590;
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
      iVar18 = uVar26 * 0xc;
    }
    if (3 < (ushort)((short)*(undefined4 *)&p_j2k->m_cp - 3U)) {
      OVar20 = p_j2k->m_private_image->numcomps;
      OVar9 = opj_j2k_get_max_coc_size(p_j2k);
      OVar17 = opj_j2k_get_max_coc_size(p_j2k);
      iVar18 = iVar18 + (OVar17 + OVar9) * (OVar20 - 1);
    }
    iVar6 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
    if (iVar6 == 0) {
      iVar6 = 0xd;
    }
    else {
      pOVar13 = &((p_j2k->m_cp).tcps)->numpocs;
      uVar26 = 0;
      do {
        uVar5 = *pOVar13;
        if (*pOVar13 < uVar26) {
          uVar5 = uVar26;
        }
        uVar26 = uVar5;
        pOVar13 = pOVar13 + 0x590;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      iVar6 = uVar26 * 9 + 0xd;
    }
    uVar26 = iVar4 + iVar18 + iVar6;
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size = uVar26;
    pOVar8 = (OPJ_BYTE *)opj_malloc((ulong)uVar26);
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = pOVar8;
    OVar16 = 0;
    if (pOVar8 != (OPJ_BYTE *)0x0) {
      if ((ushort)((short)*(undefined4 *)&p_j2k->m_cp - 3U) < 4) {
        pOVar8 = (OPJ_BYTE *)
                 opj_malloc((ulong)((p_j2k->m_specific_param).m_decoder.m_start_tile_x * 5));
        (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar8;
        if (pOVar8 == (OPJ_BYTE *)0x0) {
          return 0;
        }
        (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current = pOVar8;
      }
      OVar16 = 1;
    }
    return OVar16;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x13bf,
                "OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *p_j2k,
                                     opj_stream_private_t *p_stream,
                                     opj_event_mgr_t * p_manager)
{
    opj_cp_t * l_cp = 00;
    opj_image_t * l_image = 00;
    opj_tcp_t * l_tcp = 00;
    opj_image_comp_t * l_img_comp = 00;

    OPJ_UINT32 i, j, k;
    OPJ_INT32 l_x0, l_y0, l_x1, l_y1;
    OPJ_FLOAT32 * l_rates = 0;
    OPJ_FLOAT32 l_sot_remove;
    OPJ_UINT32 l_bits_empty, l_size_pixel;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_last_res;
    OPJ_FLOAT32(* l_tp_stride_func)(opj_tcp_t *) = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_manager);

    l_cp = &(p_j2k->m_cp);
    l_image = p_j2k->m_private_image;
    l_tcp = l_cp->tcps;

    l_bits_empty = 8 * l_image->comps->dx * l_image->comps->dy;
    l_size_pixel = l_image->numcomps * l_image->comps->prec;
    l_sot_remove = (OPJ_FLOAT32) opj_stream_tell(p_stream) / (OPJ_FLOAT32)(
                       l_cp->th * l_cp->tw);

    if (l_cp->m_specific_param.m_enc.m_tp_on) {
        l_tp_stride_func = opj_j2k_get_tp_stride;
    } else {
        l_tp_stride_func = opj_j2k_get_default_stride;
    }

    for (i = 0; i < l_cp->th; ++i) {
        for (j = 0; j < l_cp->tw; ++j) {
            OPJ_FLOAT32 l_offset = (OPJ_FLOAT32)(*l_tp_stride_func)(l_tcp) /
                                   (OPJ_FLOAT32)l_tcp->numlayers;

            /* 4 borders of the tile rescale on the image if necessary */
            l_x0 = opj_int_max((OPJ_INT32)(l_cp->tx0 + j * l_cp->tdx),
                               (OPJ_INT32)l_image->x0);
            l_y0 = opj_int_max((OPJ_INT32)(l_cp->ty0 + i * l_cp->tdy),
                               (OPJ_INT32)l_image->y0);
            l_x1 = opj_int_min((OPJ_INT32)(l_cp->tx0 + (j + 1) * l_cp->tdx),
                               (OPJ_INT32)l_image->x1);
            l_y1 = opj_int_min((OPJ_INT32)(l_cp->ty0 + (i + 1) * l_cp->tdy),
                               (OPJ_INT32)l_image->y1);

            l_rates = l_tcp->rates;

            /* Modification of the RATE >> */
            if (*l_rates > 0.0f) {
                *l_rates = (((OPJ_FLOAT32)(l_size_pixel * (OPJ_UINT32)(l_x1 - l_x0) *
                                           (OPJ_UINT32)(l_y1 - l_y0)))
                            /
                            ((*l_rates) * (OPJ_FLOAT32)l_bits_empty)
                           )
                           -
                           l_offset;
            }

            ++l_rates;

            for (k = 1; k < l_tcp->numlayers; ++k) {
                if (*l_rates > 0.0f) {
                    *l_rates = (((OPJ_FLOAT32)(l_size_pixel * (OPJ_UINT32)(l_x1 - l_x0) *
                                               (OPJ_UINT32)(l_y1 - l_y0)))
                                /
                                ((*l_rates) * (OPJ_FLOAT32)l_bits_empty)
                               )
                               -
                               l_offset;
                }

                ++l_rates;
            }

            ++l_tcp;

        }
    }

    l_tcp = l_cp->tcps;

    for (i = 0; i < l_cp->th; ++i) {
        for (j = 0; j < l_cp->tw; ++j) {
            l_rates = l_tcp->rates;

            if (*l_rates > 0.0f) {
                *l_rates -= l_sot_remove;

                if (*l_rates < 30.0f) {
                    *l_rates = 30.0f;
                }
            }

            ++l_rates;

            l_last_res = l_tcp->numlayers - 1;

            for (k = 1; k < l_last_res; ++k) {

                if (*l_rates > 0.0f) {
                    *l_rates -= l_sot_remove;

                    if (*l_rates < * (l_rates - 1) + 10.0f) {
                        *l_rates  = (*(l_rates - 1)) + 20.0f;
                    }
                }

                ++l_rates;
            }

            if (*l_rates > 0.0f) {
                *l_rates -= (l_sot_remove + 2.f);

                if (*l_rates < * (l_rates - 1) + 10.0f) {
                    *l_rates  = (*(l_rates - 1)) + 20.0f;
                }
            }

            ++l_tcp;
        }
    }

    l_img_comp = l_image->comps;
    l_tile_size = 0;

    for (i = 0; i < l_image->numcomps; ++i) {
        l_tile_size += (opj_uint_ceildiv(l_cp->tdx, l_img_comp->dx)
                        *
                        opj_uint_ceildiv(l_cp->tdy, l_img_comp->dy)
                        *
                        l_img_comp->prec
                       );

        ++l_img_comp;
    }

    /* TODO: where does this magic value come from ? */
    /* This used to be 1.3 / 8, but with random data and very small code */
    /* block sizes, this is not enough. For example with */
    /* bin/test_tile_encoder 1 256 256 32 32 8 0 reversible_with_precinct.j2k 4 4 3 0 0 1 16 16 */
    /* TODO revise this to take into account the overhead linked to the */
    /* number of packets and number of code blocks in packets */
    l_tile_size = (OPJ_UINT32)(l_tile_size * 1.4 / 8);

    /* Arbitrary amount to make the following work: */
    /* bin/test_tile_encoder 1 256 256 17 16 8 0 reversible_no_precinct.j2k 4 4 3 0 0 1 */
    l_tile_size += 500;

    l_tile_size += opj_j2k_get_specific_header_sizes(p_j2k);

    p_j2k->m_specific_param.m_encoder.m_encoded_tile_size = l_tile_size;
    p_j2k->m_specific_param.m_encoder.m_encoded_tile_data =
        (OPJ_BYTE *) opj_malloc(p_j2k->m_specific_param.m_encoder.m_encoded_tile_size);
    if (p_j2k->m_specific_param.m_encoder.m_encoded_tile_data == 00) {
        return OPJ_FALSE;
    }

    if (OPJ_IS_CINEMA(l_cp->rsiz)) {
        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer =
            (OPJ_BYTE *) opj_malloc(5 *
                                    p_j2k->m_specific_param.m_encoder.m_total_tile_parts);
        if (! p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer) {
            return OPJ_FALSE;
        }

        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current =
            p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer;
    }

    return OPJ_TRUE;
}